

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::ElementArrayBufferBindingTestCase::test
          (ElementArrayBufferBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  ScopedLogSection SVar1;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  GetNameFunc local_420;
  int local_418;
  string local_410;
  allocator<char> local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  GLenum local_364;
  GetNameFunc p_Stack_360;
  deUint32 err_3;
  int local_358;
  GetNameFunc local_350;
  int local_348;
  string local_340;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  GLenum local_294;
  GetNameFunc p_Stack_290;
  deUint32 err_2;
  int local_288;
  GetNameFunc local_280;
  int local_278;
  string local_270;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  GLenum local_1c4;
  GLuint GStack_1c0;
  deUint32 err_1;
  GLuint buffers [2];
  GLuint vaos [2];
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  ScopedLogSection local_160;
  ScopedLogSection section_1;
  TestLog *local_148;
  int local_140;
  string local_138;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  GLenum local_8c;
  GLuint local_88;
  deUint32 err;
  GLuint bufferObject;
  allocator<char> local_49;
  string local_48;
  ScopedLogSection local_28;
  ScopedLogSection section;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  ElementArrayBufferBindingTestCase *this_local;
  
  section.m_log = (TestLog *)result;
  pTVar3 = glu::CallLogWrapper::getLog(gl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"DefaultVAO",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bufferObject,"Test with default VAO",(allocator<char> *)((long)&err + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_28,pTVar3,&local_48,(string *)&bufferObject);
  std::__cxx11::string::~string((string *)&bufferObject);
  std::allocator<char>::~allocator((allocator<char> *)((long)&err + 3));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,0,(this->super_BindingTest).m_type);
  local_88 = 0;
  glu::CallLogWrapper::glGenBuffers(gl,1,&local_88);
  do {
    local_8c = glu::CallLogWrapper::glGetError(gl);
    SVar1 = section;
    if (local_8c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"Got Error ",&local_111);
      EVar4 = glu::getErrorStr(local_8c);
      section_1.m_log = (TestLog *)EVar4.m_getName;
      local_140 = EVar4.m_value;
      local_148 = section_1.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_138,&local_148);
      std::operator+(&local_f0,&local_110,&local_138);
      std::operator+(&local_d0,&local_f0,": ");
      std::operator+(&local_b0,&local_d0,"glGenBuffers");
      tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glBindBuffer(gl,0x8893,local_88);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,local_88,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteBuffers(gl,1,&local_88);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,0,(this->super_BindingTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&local_28);
  pTVar3 = glu::CallLogWrapper::getLog(gl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"WithVAO",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"Test with VAO",(allocator<char> *)((long)vaos + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_160,pTVar3,&local_180,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)vaos + 7));
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  buffers[0] = 0;
  buffers[1] = 0;
  _GStack_1c0 = 0;
  glu::CallLogWrapper::glGenVertexArrays(gl,2,buffers);
  do {
    local_1c4 = glu::CallLogWrapper::glGetError(gl);
    SVar1 = section;
    if (local_1c4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"Got Error ",&local_249);
      EVar4 = glu::getErrorStr(local_1c4);
      p_Stack_290 = EVar4.m_getName;
      local_288 = EVar4.m_value;
      local_280 = p_Stack_290;
      local_278 = local_288;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_280);
      std::operator+(&local_228,&local_248,&local_270);
      std::operator+(&local_208,&local_228,": ");
      std::operator+(&local_1e8,&local_208,"glGenVertexArrays");
      tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glGenBuffers(gl,2,&GStack_1c0);
  do {
    local_294 = glu::CallLogWrapper::glGetError(gl);
    SVar1 = section;
    if (local_294 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,"Got Error ",&local_319);
      EVar4 = glu::getErrorStr(local_294);
      p_Stack_360 = EVar4.m_getName;
      local_358 = EVar4.m_value;
      local_350 = p_Stack_360;
      local_348 = local_358;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_340,&local_350);
      std::operator+(&local_2f8,&local_318,&local_340);
      std::operator+(&local_2d8,&local_2f8,": ");
      std::operator+(&local_2b8,&local_2d8,"glGenBuffers");
      tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator(&local_319);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glBindVertexArray(gl,buffers[0]);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,0,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindBuffer(gl,0x8893,GStack_1c0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,GStack_1c0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glBindVertexArray(gl,buffers[1]);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,0,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindBuffer(gl,0x8893,err_1);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,err_1,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindVertexArray(gl,buffers[0]);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,GStack_1c0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glDeleteBuffers(gl,2,&GStack_1c0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,0,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindVertexArray(gl,buffers[1]);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)section.m_log,gl,0x8895,err_1,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteVertexArrays(gl,2,buffers);
  do {
    local_364 = glu::CallLogWrapper::glGetError(gl);
    SVar1 = section;
    if (local_364 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"Got Error ",&local_3e9);
      EVar4 = glu::getErrorStr(local_364);
      local_420 = EVar4.m_getName;
      local_418 = EVar4.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_410,&local_420);
      std::operator+(&local_3c8,&local_3e8,&local_410);
      std::operator+(&local_3a8,&local_3c8,": ");
      std::operator+(&local_388,&local_3a8,"glDeleteVertexArrays");
      tcu::ResultCollector::fail((ResultCollector *)SVar1.m_log,&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_160);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(gl.getLog(), "DefaultVAO", "Test with default VAO");

			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			GLuint bufferObject = 0;
			gl.glGenBuffers(1, &bufferObject);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenBuffers");

			gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, bufferObject);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, bufferObject, m_type);

			gl.glDeleteBuffers(1, &bufferObject);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(gl.getLog(), "WithVAO", "Test with VAO");

			GLuint vaos[2]		= {0};
			GLuint buffers[2]	= {0};

			gl.glGenVertexArrays(2, vaos);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenVertexArrays");

			gl.glGenBuffers(2, buffers);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenBuffers");

			// initial
			gl.glBindVertexArray(vaos[0]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			// after setting
			gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffers[0]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[0], m_type);

			// initial of vao 2
			gl.glBindVertexArray(vaos[1]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			// after setting to 2
			gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffers[1]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[1], m_type);

			// vao 1 still has buffer 1 bound?
			gl.glBindVertexArray(vaos[0]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[0], m_type);

			// deleting clears from bound vaos ...
			gl.glDeleteBuffers(2, buffers);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			// ... but does not from non-bound vaos?
			gl.glBindVertexArray(vaos[1]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[1], m_type);

			gl.glDeleteVertexArrays(2, vaos);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteVertexArrays");
		}
	}